

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O3

deBool qpXmlWriter_writeStringElement(qpXmlWriter *writer,char *elementName,char *elementContent)

{
  qpXmlWriter_startElement(writer,elementName,0,(qpXmlAttribute *)0x0);
  if (elementContent != (char *)0x0) {
    qpXmlWriter_writeString(writer,elementContent);
  }
  qpXmlWriter_endElement(writer,elementName);
  return 1;
}

Assistant:

deBool qpXmlWriter_writeStringElement (qpXmlWriter* writer, const char* elementName, const char* elementContent)
{
	if (!qpXmlWriter_startElement(writer, elementName, 0, DE_NULL) ||
		(elementContent && !qpXmlWriter_writeString(writer, elementContent)) ||
		!qpXmlWriter_endElement(writer, elementName))
		return DE_FALSE;

	return DE_TRUE;
}